

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

int Wlc_NtkAbsCore(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  int iVar1;
  int nPpis;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Gia_Man_t *pGVar5;
  Vec_Int_t *vRefine_00;
  abctime aVar6;
  Wlc_Ntk_t *local_140;
  Wlc_Ntk_t *pAbs;
  Gia_Man_t *pTemp;
  Gia_Man_t *pGia;
  Vec_Int_t *vRefine;
  Vec_Int_t *vPisNew;
  Abc_Cex_t *pCex;
  Aig_Man_t *pAig;
  Pdr_Par_t *pPdrPars;
  Pdr_Par_t PdrPars;
  Vec_Bit_t *vUnmark;
  int RetValue;
  int nDcFlops;
  int nNodes;
  int nIters;
  Vec_Int_t *vBlacks;
  abctime clk;
  Wlc_Par_t *pPars_local;
  Wlc_Ntk_t *p_local;
  
  clk = (abctime)pPars;
  pPars_local = (Wlc_Par_t *)p;
  vBlacks = (Vec_Int_t *)Abc_Clock();
  _nNodes = (Vec_Int_t *)0x0;
  vUnmark._0_4_ = -1;
  iVar1 = Wlc_NtkObjNumMax((Wlc_Ntk_t *)pPars_local);
  PdrPars.pInvFileName = (char *)Vec_BitStart(iVar1);
  pAig = (Aig_Man_t *)&pPdrPars;
  Pdr_ManSetDefaultParams((Pdr_Par_t *)pAig);
  *(undefined4 *)((long)&(pAig->Ghost).field_5 + 4) = *(undefined4 *)(clk + 0x54);
  pAig->nRegs = 0;
  nDcFlops = 1;
  do {
    if (*(int *)(clk + 0x10) <= nDcFlops) {
LAB_00b34e1c:
      Vec_IntFree(_nNodes);
      Vec_BitFree((Vec_Bit_t *)PdrPars.pInvFileName);
      if (*(int *)(clk + 0x50) != 0) {
        printf("\n");
      }
      printf("Abstraction ");
      if ((int)vUnmark == 0) {
        printf("resulted in a real CEX");
      }
      else if ((int)vUnmark == 1) {
        printf("is successfully proved");
      }
      else {
        printf("timed out");
      }
      printf(" after %d iterations. ",(ulong)(uint)nDcFlops);
      aVar6 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar6 - (long)vBlacks);
      return (int)vUnmark;
    }
    if (*(int *)(clk + 0x50) != 0) {
      printf("\nIteration %d:\n",(ulong)(uint)nDcFlops);
    }
    if (*(int *)(clk + 0x3c) == 0) {
      if ((nDcFlops == 1) && (*(int *)(clk + 0x14) < 1000000000)) {
        Wlc_NtkSetUnmark((Wlc_Ntk_t *)pPars_local,(Wlc_Par_t *)clk,(Vec_Bit_t *)PdrPars.pInvFileName
                        );
      }
      local_140 = Wlc_NtkAbs((Wlc_Ntk_t *)pPars_local,(Wlc_Par_t *)clk,
                             (Vec_Bit_t *)PdrPars.pInvFileName,&vRefine,(Vec_Int_t **)0x0,
                             *(int *)(clk + 0x50));
    }
    else {
      if (_nNodes == (Vec_Int_t *)0x0) {
        _nNodes = Wlc_NtkGetBlacks((Wlc_Ntk_t *)pPars_local,(Wlc_Par_t *)clk);
      }
      else {
        Wlc_NtkUpdateBlacks((Wlc_Ntk_t *)pPars_local,(Wlc_Par_t *)clk,(Vec_Int_t **)&nNodes,
                            (Vec_Bit_t *)PdrPars.pInvFileName,(Vec_Int_t *)0x0);
      }
      local_140 = Wlc_NtkAbs2((Wlc_Ntk_t *)pPars_local,_nNodes,(Vec_Int_t **)0x0);
      vRefine = Vec_IntDup(_nNodes);
    }
    pGVar5 = Wlc_NtkBitBlast(local_140,(Wlc_BstPar_t *)0x0);
    iVar1 = Wlc_NtkDcFlopNum(local_140);
    pTemp = pGVar5;
    if (0 < iVar1) {
      nPpis = Wlc_NtkCountObjBits((Wlc_Ntk_t *)pPars_local,vRefine);
      pTemp = Gia_ManPermuteInputs(pGVar5,nPpis,iVar1);
      Gia_ManStop(pGVar5);
    }
    if (*(int *)(clk + 0x18) != 0) {
      pGVar5 = Gia_ManTransformMiter2(pTemp);
      Gia_ManStop(pTemp);
      pTemp = pGVar5;
    }
    if (*(int *)(clk + 0x50) != 0) {
      uVar2 = Wlc_NtkObjNum(local_140);
      uVar3 = Vec_IntSize(vRefine);
      printf("Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n",
             (ulong)uVar2,(ulong)uVar3);
      Gia_ManPrintStats(pTemp,(Gps_Par_t *)0x0);
    }
    Wlc_NtkFree(local_140);
    pCex = (Abc_Cex_t *)Gia_ManToAigSimple(pTemp);
    vUnmark._0_4_ = Pdr_ManSolve((Aig_Man_t *)pCex,(Pdr_Par_t *)pAig);
    vPisNew = *(Vec_Int_t **)&pCex[0x14].nRegs;
    pCex[0x14].nRegs = 0;
    pCex[0x14].nPis = 0;
    Aig_ManStop((Aig_Man_t *)pCex);
    if (vPisNew == (Vec_Int_t *)0x0) {
      if ((int)vUnmark == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                      ,0x74a,"int Wlc_NtkAbsCore(Wlc_Ntk_t *, Wlc_Par_t *)");
      }
      Gia_ManStop(pTemp);
      Vec_IntFree(vRefine);
      goto LAB_00b34e1c;
    }
    vRefine_00 = Wlc_NtkAbsRefinement((Wlc_Ntk_t *)pPars_local,pTemp,(Abc_Cex_t *)vPisNew,vRefine);
    Gia_ManStop(pTemp);
    Vec_IntFree(vRefine);
    if (vRefine_00 == (Vec_Int_t *)0x0) {
      Abc_CexFree((Abc_Cex_t *)vPisNew);
      goto LAB_00b34e1c;
    }
    uVar2 = Wlc_NtkRemoveFromAbstraction
                      ((Wlc_Ntk_t *)pPars_local,vRefine_00,(Vec_Bit_t *)PdrPars.pInvFileName);
    if (*(int *)(clk + 0x50) != 0) {
      uVar3 = vPisNew->nSize;
      uVar4 = Vec_IntSize(vRefine_00);
      printf("Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n"
             ,(ulong)uVar3,(ulong)uVar4,(ulong)uVar2);
    }
    Vec_IntFree(vRefine_00);
    Abc_CexFree((Abc_Cex_t *)vPisNew);
    nDcFlops = nDcFlops + 1;
  } while( true );
}

Assistant:

int Wlc_NtkAbsCore( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vBlacks = NULL;
    int nIters, nNodes, nDcFlops, RetValue = -1;
    // start the bitmap to mark objects that cannot be abstracted because of refinement
    // currently, this bitmap is empty because abstraction begins without refinement
    Vec_Bit_t * vUnmark = Vec_BitStart( Wlc_NtkObjNumMax(p) );
    // set up parameters to run PDR
    Pdr_Par_t PdrPars, * pPdrPars = &PdrPars;
    Pdr_ManSetDefaultParams( pPdrPars );
    //pPdrPars->fUseAbs    = 1;   // use 'pdr -t'  (on-the-fly abstraction)
    //pPdrPars->fCtgs      = 1;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->fSkipDown  = 0;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->nRestLimit = 500; // reset queue or proof-obligations when it gets larger than this
    pPdrPars->fVerbose   = pPars->fPdrVerbose;
    pPdrPars->fVeryVerbose = 0;
    // perform refinement iterations
    for ( nIters = 1; nIters < pPars->nIterMax; nIters++ )
    {
        Aig_Man_t * pAig;
        Abc_Cex_t * pCex;
        Vec_Int_t * vPisNew, * vRefine;  
        Gia_Man_t * pGia, * pTemp;
        Wlc_Ntk_t * pAbs;

        if ( pPars->fVerbose )
            printf( "\nIteration %d:\n", nIters );

        // get abstracted GIA and the set of pseudo-PIs (vPisNew)
        if ( pPars->fAbs2 )
        {
            if ( vBlacks == NULL )
                vBlacks = Wlc_NtkGetBlacks( p, pPars );
            else
                Wlc_NtkUpdateBlacks( p, pPars, &vBlacks, vUnmark, NULL );
            pAbs = Wlc_NtkAbs2( p, vBlacks, NULL );
            vPisNew = Vec_IntDup( vBlacks );
        }
        else
        {
            if ( nIters == 1 && pPars->nLimit < ABC_INFINITY )
                Wlc_NtkSetUnmark( p, pPars, vUnmark );

            pAbs = Wlc_NtkAbs( p, pPars, vUnmark, &vPisNew, NULL, pPars->fVerbose );
        }
        pGia = Wlc_NtkBitBlast( pAbs, NULL );

        // if the abstraction has flops with DC-init state,
        // new PIs were introduced by bit-blasting at the end of the PI list
        // here we move these variables to be *before* PPIs, because
        // PPIs are supposed to be at the end of the PI list for refinement
        nDcFlops = Wlc_NtkDcFlopNum(pAbs);
        if ( nDcFlops > 0 ) // DC-init flops are present
        {
            pGia = Gia_ManPermuteInputs( pTemp = pGia, Wlc_NtkCountObjBits(p, vPisNew), nDcFlops );
            Gia_ManStop( pTemp );
        }
        // if the word-level outputs have to be XORs, this is a place to do it
        if ( pPars->fXorOutput )
        {
            pGia = Gia_ManTransformMiter2( pTemp = pGia );
            Gia_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
        {
            printf( "Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n", Wlc_NtkObjNum(pAbs), Vec_IntSize(vPisNew) ); 
            Gia_ManPrintStats( pGia, NULL );
        }
        Wlc_NtkFree( pAbs );

        // try to prove abstracted GIA by converting it to AIG and calling PDR
        pAig = Gia_ManToAigSimple( pGia );
        RetValue = Pdr_ManSolve( pAig, pPdrPars );
        pCex = pAig->pSeqModel; pAig->pSeqModel = NULL;
        Aig_ManStop( pAig );

        // consider outcomes
        if ( pCex == NULL ) 
        {
            assert( RetValue ); // proved or undecided
            Gia_ManStop( pGia );
            Vec_IntFree( vPisNew );
            break;
        }

        // perform refinement
        vRefine = Wlc_NtkAbsRefinement( p, pGia, pCex, vPisNew );
        Gia_ManStop( pGia );
        Vec_IntFree( vPisNew );
        if ( vRefine == NULL ) // real CEX
        {
            Abc_CexFree( pCex ); // return CEX in the future
            break;
        }

        // update the set of objects to be un-abstracted
        nNodes = Wlc_NtkRemoveFromAbstraction( p, vRefine, vUnmark );
        if ( pPars->fVerbose )
            printf( "Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n", pCex->iFrame, Vec_IntSize(vRefine), nNodes );
        Vec_IntFree( vRefine );
        Abc_CexFree( pCex );
    }
    Vec_IntFree( vBlacks );
    Vec_BitFree( vUnmark );
    // report the result
    if ( pPars->fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 )
        printf( "resulted in a real CEX" );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", nIters );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}